

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall AActor::SetOrigin(AActor *this,double x,double y,double z,bool moving)

{
  undefined1 local_40 [8];
  FLinkContext ctx;
  bool moving_local;
  double z_local;
  double y_local;
  double x_local;
  AActor *this_local;
  
  ctx.render_list._7_1_ = moving;
  FLinkContext::FLinkContext((FLinkContext *)local_40);
  UnlinkFromWorld(this,(FLinkContext *)local_40);
  SetXYZ(this,x,y,z);
  LinkToWorld(this,(FLinkContext *)local_40,false,(sector_t *)0x0);
  P_FindFloorCeiling(this,1);
  if ((ctx.render_list._7_1_ & 1) == 0) {
    ClearInterpolation(this);
  }
  return;
}

Assistant:

void AActor::SetOrigin(double x, double y, double z, bool moving)
{
	FLinkContext ctx;
	UnlinkFromWorld (&ctx);
	SetXYZ(x, y, z);
	LinkToWorld (&ctx);
	P_FindFloorCeiling(this, FFCF_ONLYSPAWNPOS);
	if (!moving) ClearInterpolation();
}